

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (CodedInputStream *input,RepeatedField<int> *values)

{
  uint8 uVar1;
  uint8 *puVar2;
  uint32 uVar3;
  bool bVar4;
  Limit limit;
  int iVar5;
  int value;
  uint32 length;
  uint32 local_30;
  uint32 local_2c;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
    input->buffer_ = puVar2 + 1;
    local_30 = (int)(char)uVar1;
  }
  else {
    bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_30);
    if (!bVar4) {
      return false;
    }
  }
  limit = io::CodedInputStream::PushLimit(input,local_30);
  iVar5 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar5) {
    do {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        bVar4 = true;
        local_2c = (int)(char)uVar1;
      }
      else {
        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_2c);
      }
      uVar3 = local_2c;
      if (bVar4 == false) {
        return false;
      }
      if (values->current_size_ == values->total_size_) {
        RepeatedField<int>::Reserve(values,values->total_size_ + 1);
      }
      iVar5 = values->current_size_;
      values->current_size_ = iVar5 + 1;
      values->elements_[iVar5] = uVar3;
      iVar5 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar5);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedPrimitiveNoInline(io::CodedInputStream* input,
                                                 RepeatedField<CType>* values) {
  return ReadPackedPrimitive<CType, DeclaredType>(input, values);
}